

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O2

int __thiscall QualEngine::close(QualEngine *this,int __fd)

{
  pointer piVar1;
  pointer pcVar2;
  
  if (this->qualSolver != (QualSolver *)0x0) {
    (*this->qualSolver->_vptr_QualSolver[1])();
  }
  this->qualSolver = (QualSolver *)0x0;
  piVar1 = (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  pcVar2 = (this->flowDirection).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flowDirection).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar2) {
    (this->flowDirection).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  this->engineState = CLOSED;
  return (int)pcVar2;
}

Assistant:

void QualEngine::close()
{
    delete qualSolver;
    qualSolver = nullptr;
    sortedLinks.clear();
    flowDirection.clear();
    engineState = QualEngine::CLOSED;
}